

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O1

string * __thiscall
absl::lts_20250127::HexStringToBytes_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,string_view from)

{
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)((ulong)this >> 1));
  if ((lts_20250127 *)0x1 < this) {
    uVar1 = 0;
    do {
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar1] =
           (anonymous_namespace)::kHexValueLenient[*(byte *)(from._M_len + uVar1 * 2)] * '\x10' +
           (anonymous_namespace)::kHexValueLenient[*(byte *)(from._M_len + 1 + uVar1 * 2)];
      uVar1 = uVar1 + 1;
    } while ((ulong)this >> 1 != uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HexStringToBytes(absl::string_view from) {
  std::string result;
  const auto num = from.size() / 2;
  strings_internal::STLStringResizeUninitialized(&result, num);
  absl::HexStringToBytesInternal<std::string&>(from.data(), result, num);
  return result;
}